

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O0

void __thiscall HttpConnPool::start(HttpConnPool *this)

{
  HttpConn *this_00;
  undefined1 local_28 [8];
  HttpConnPtr hc;
  int i;
  HttpConnPool *this_local;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  for (hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
      hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <
      this->connNum_;
      hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1)
  {
    this_00 = (HttpConn *)operator_new(0x188);
    HttpConn::HttpConn(this_00,this->server_,-1);
    std::shared_ptr<HttpConn>::shared_ptr<HttpConn,void>((shared_ptr<HttpConn> *)local_28,this_00);
    std::__cxx11::list<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>::
    push_back(&this->freeConnPool_,(shared_ptr<HttpConn> *)local_28);
    std::shared_ptr<HttpConn>::~shared_ptr((shared_ptr<HttpConn> *)local_28);
  }
  return;
}

Assistant:

void start() {
       baseLoop_->assertInLoopThread();
       started_ = true;
       for (int i = 0; i < connNum_; ++i) {
           HttpConnPtr hc(new HttpConn(server_, -1));
           freeConnPool_.push_back(std::move(hc));
       }
    }